

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

numeric * __thiscall
cs_impl::
cni_helper<cs::numeric(*)(cs::numeric_const&,cs::numeric_const&),cs::numeric(*)(cs::numeric_const&,cs::numeric_const&)>
::_call<0,1>(numeric *__return_storage_ptr__,void *this,vector *args,sequence<0,_1> *param_2)

{
  numeric *pnVar1;
  numeric *pnVar2;
  numeric_integer local_48;
  undefined8 uStack_40;
  bool local_38;
  
  pnVar1 = try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_0UL>::
           convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Vector_impl_data._M_start);
  pnVar2 = try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_1UL>::
           convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Vector_impl_data._M_start + 1);
  if (*(long *)((long)this + 0x10) != 0) {
    (**(code **)((long)this + 0x18))(&local_48,this,pnVar1,pnVar2);
    (__return_storage_ptr__->data)._int = local_48;
    *(undefined8 *)((long)&__return_storage_ptr__->data + 8) = uStack_40;
    __return_storage_ptr__->type = local_38;
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}